

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void dumpfile(char *filename,void *data,size_t len)

{
  FILE *__s;
  size_t sVar1;
  size_t in_RDX;
  void *in_RSI;
  char *in_RDI;
  FILE *f;
  ssize_t bytes_written;
  
  __s = fopen(in_RDI,"wb");
  if (__s == (FILE *)0x0) {
    logprintf("Can\'t open file %s for writing\n",in_RDI);
  }
  else {
    sVar1 = fwrite(in_RSI,1,in_RDX,__s);
    if ((long)sVar1 < (long)in_RDX) {
      logprintf("Can\'t write file %s\n",in_RDI);
    }
    fclose(__s);
  }
  return;
}

Assistant:

void
dumpfile(const char *filename, void *data, size_t len)
{
	ssize_t bytes_written;
	FILE *f;

	f = fopen(filename, "wb");
	if (f == NULL) {
		logprintf("Can't open file %s for writing\n", filename);
		return;
	}
	bytes_written = fwrite(data, 1, len, f);
	if (bytes_written < (ssize_t)len)
		logprintf("Can't write file %s\n", filename);
	fclose(f);
}